

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall MyXmlParser::onStartElement(MyXmlParser *this,char *name,char **attributes)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (this->m_indent != 0) {
    uVar4 = 0;
    do {
      printf("  ");
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->m_indent);
  }
  printf("<%s",name);
  if (*attributes != (char *)0x0) {
    putchar(10);
    sVar2 = this->m_indent;
    sVar1 = sVar2 + 1;
    this->m_indent = sVar1;
    pcVar3 = *attributes;
    if (pcVar3 != (char *)0x0) {
      do {
        if (sVar1 != 0) {
          uVar4 = 0;
          do {
            printf("  ");
            uVar4 = uVar4 + 1;
          } while (uVar4 < this->m_indent);
          pcVar3 = *attributes;
        }
        printf("%s = %s\n",pcVar3,attributes[1]);
        pcVar3 = attributes[2];
        attributes = attributes + 2;
        sVar1 = this->m_indent;
      } while (pcVar3 != (char *)0x0);
      sVar2 = sVar1 - 1;
    }
    this->m_indent = sVar2;
    if (sVar2 != 0) {
      uVar4 = 0;
      do {
        printf("  ");
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->m_indent);
    }
  }
  puts(">");
  this->m_indent = this->m_indent + 1;
  return;
}

Assistant:

void
	onStartElement(
		const char* name,
		const char** attributes
	) {
		printIndent();
		printf("<%s", name);

		if (*attributes) {
			printf("\n");
			m_indent++;

			while (*attributes) {
				printIndent();
				printf("%s = %s\n", attributes [0], attributes [1]);
				attributes += 2;
			}

			m_indent--;
			printIndent();
		}

		printf(">\n");
		m_indent++;
	}